

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
* __thiscall
jessilib::
split_once<std::vector<char32_t,std::allocator<char32_t>>,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,char32_t>
          (pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
          begin,__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                end,char32_t in_delim)

{
  bool bVar1;
  reference pcVar2;
  vector<char32_t,_std::allocator<char32_t>_> local_e0;
  char32_t *local_c8;
  char32_t *local_c0;
  vector<char32_t,_std::allocator<char32_t>_> local_b8;
  char32_t *local_90;
  char32_t *local_88;
  vector<char32_t,_std::allocator<char32_t>_> local_80;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_68;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> itr;
  undefined1 local_58 [8];
  pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  result;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> _Stack_20;
  char32_t in_delim_local;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> end_local;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> begin_local
  ;
  
  result.second.super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (char32_t)end._M_current;
  _Stack_20._M_current = begin._M_current;
  end_local._M_current = (char32_t *)this;
  std::
  pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  ::
  pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>,_true>
            ((pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
              *)local_58);
  itr._M_current._7_1_ =
       __gnu_cxx::operator<=><char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>
                 (&end_local,&stack0xffffffffffffffe0);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    std::
    pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
            *)local_58);
  }
  else {
    local_68._M_current = end_local._M_current;
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        (&local_68,&stack0xffffffffffffffe0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               ::operator*(&local_68);
      if (*pcVar2 ==
          result.second.super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_) {
        local_88 = end_local._M_current;
        local_90 = local_68._M_current;
        make_split_member<std::vector<char32_t,_std::allocator<char32_t>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_nullptr>
                  (&local_80,end_local,local_68);
        std::vector<char32_t,_std::allocator<char32_t>_>::operator=
                  ((vector<char32_t,_std::allocator<char32_t>_> *)local_58,&local_80);
        std::vector<char32_t,_std::allocator<char32_t>_>::~vector(&local_80);
        local_c0 = (char32_t *)
                   __gnu_cxx::
                   __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                   ::operator+(&local_68,1);
        local_c8 = _Stack_20._M_current;
        make_split_member<std::vector<char32_t,_std::allocator<char32_t>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_nullptr>
                  (&local_b8,
                   (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                    )local_c0,_Stack_20);
        std::vector<char32_t,_std::allocator<char32_t>_>::operator=
                  ((vector<char32_t,_std::allocator<char32_t>_> *)
                   &result.first.super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_b8);
        std::vector<char32_t,_std::allocator<char32_t>_>::~vector(&local_b8);
        std::
        pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
        ::pair(__return_storage_ptr__,
               (pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                *)local_58);
        goto LAB_004ef186;
      }
      __gnu_cxx::
      __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
      operator++(&local_68);
    }
    make_split_member<std::vector<char32_t,_std::allocator<char32_t>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_nullptr>
              (&local_e0,end_local,_Stack_20);
    std::vector<char32_t,_std::allocator<char32_t>_>::operator=
              ((vector<char32_t,_std::allocator<char32_t>_> *)local_58,&local_e0);
    std::vector<char32_t,_std::allocator<char32_t>_>::~vector(&local_e0);
    std::
    pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
            *)local_58);
  }
LAB_004ef186:
  itr._M_current._0_4_ = 1;
  std::
  pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  ::~pair((pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
           *)local_58);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}